

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::Config::Config(Config *this,ConfigData *data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  size_type sVar3;
  ulong uVar4;
  size_type sVar5;
  int iVar6;
  pointer pbVar7;
  ulong uVar8;
  ConfigData *pCVar9;
  long lVar10;
  bool bVar11;
  bool bVar12;
  string filter;
  string groupName;
  TestCaseFilters filters;
  string local_178;
  ConfigData *local_158;
  vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *local_150;
  ConfigData *local_148;
  undefined1 *local_140;
  ulong local_138;
  undefined1 local_130 [16];
  TestCaseFilter local_120;
  string local_f8;
  undefined1 *local_d8;
  size_t local_d0;
  undefined1 local_c8 [16];
  undefined1 *local_b8;
  size_t local_b0;
  undefined1 local_a8 [16];
  TestCaseFilters local_98;
  
  (this->super_SharedImpl<Catch::IConfig>).m_rc = 0;
  (this->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable.
  _vptr_NonCopyable = (_func_int **)&PTR__Config_001616b0;
  pCVar9 = &this->m_data;
  ConfigData::ConfigData(pCVar9,data);
  (this->m_stream).streamBuf = (streambuf *)0x0;
  (this->m_stream).isOwned = false;
  std::ostream::ostream
            (&this->m_os,*(streambuf **)(std::ofstream::ofstream + *(long *)(std::cout + -0x18)));
  (this->m_filterSets).
  super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_filterSets).
  super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_filterSets).
  super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((data->testsOrTags).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (data->testsOrTags).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_150 = &this->m_filterSets;
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_local_buf[0] = '\0';
    local_158 = pCVar9;
    if ((data->testsOrTags).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (data->testsOrTags).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar10 = 8;
      uVar8 = 0;
      do {
        if (uVar8 != 0) {
          std::__cxx11::string::append((char *)&local_f8);
        }
        std::__cxx11::string::_M_append
                  ((char *)&local_f8,
                   *(ulong *)((long)(data->testsOrTags).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar10 + -8));
        uVar8 = uVar8 + 1;
        lVar10 = lVar10 + 0x20;
      } while (uVar8 < (ulong)((long)(data->testsOrTags).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(data->testsOrTags).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    TestCaseFilters::TestCaseFilters(&local_98,&local_f8);
    pbVar7 = (data->testsOrTags).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((data->testsOrTags).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pbVar7) {
      lVar10 = 8;
      uVar8 = 0;
      local_148 = data;
      do {
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        lVar2 = *(long *)((long)pbVar7 + lVar10 + -8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_178,lVar2,
                   *(long *)((long)&(pbVar7->_M_dataplus)._M_p + lVar10) + lVar2);
        local_120.m_stringToMatch._M_dataplus._M_p = (pointer)&local_120.m_stringToMatch.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"[","");
        sVar5 = local_120.m_stringToMatch._M_string_length;
        sVar3 = local_178._M_string_length;
        if ((local_178._M_string_length < local_120.m_stringToMatch._M_string_length) ||
           (std::__cxx11::string::substr((ulong)&local_d8,(ulong)&local_178),
           local_d0 != local_120.m_stringToMatch._M_string_length)) {
          bVar11 = false;
        }
        else if (local_d0 == 0) {
          bVar11 = true;
        }
        else {
          iVar6 = bcmp(local_d8,local_120.m_stringToMatch._M_dataplus._M_p,local_d0);
          bVar11 = iVar6 == 0;
        }
        if ((sVar5 <= sVar3) && (local_d8 != local_c8)) {
          operator_delete(local_d8);
        }
        bVar12 = true;
        if (!bVar11) {
          local_140 = local_130;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"~[","");
          uVar4 = local_138;
          sVar3 = local_178._M_string_length;
          if ((local_178._M_string_length < local_138) ||
             (std::__cxx11::string::substr((ulong)&local_b8,(ulong)&local_178),
             local_b0 != local_138)) {
            bVar12 = false;
          }
          else if (local_b0 == 0) {
            bVar12 = true;
          }
          else {
            iVar6 = bcmp(local_b8,local_140,local_b0);
            bVar12 = iVar6 == 0;
          }
          if ((uVar4 <= sVar3) && (local_b8 != local_a8)) {
            operator_delete(local_b8);
          }
        }
        paVar1 = &local_120.m_stringToMatch.field_2;
        if ((!bVar11) && (local_140 != local_130)) {
          operator_delete(local_140);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120.m_stringToMatch._M_dataplus._M_p != paVar1) {
          operator_delete(local_120.m_stringToMatch._M_dataplus._M_p);
        }
        if (bVar12) {
          TestCaseFilters::addTags(&local_98,&local_178);
          pCVar9 = local_148;
        }
        else {
          TestCaseFilter::TestCaseFilter(&local_120,&local_178,AutoDetectBehaviour);
          pCVar9 = local_148;
          TestCaseFilters::addFilter(&local_98,&local_120);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120.m_stringToMatch._M_dataplus._M_p != paVar1) {
            operator_delete(local_120.m_stringToMatch._M_dataplus._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p);
        }
        uVar8 = uVar8 + 1;
        pbVar7 = (pCVar9->testsOrTags).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar10 = lVar10 + 0x20;
      } while (uVar8 < (ulong)((long)(pCVar9->testsOrTags).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5)
              );
    }
    std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::push_back
              (local_150,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.m_name._M_dataplus._M_p != &local_98.m_name.field_2) {
      operator_delete(local_98.m_name._M_dataplus._M_p);
    }
    std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>::~vector
              (&local_98.m_exclusionFilters);
    std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>::~vector
              (&local_98.m_inclusionFilters);
    std::vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>::~vector
              (&local_98.m_tagExpressions);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

Config( ConfigData const& data )
        :   m_data( data ),
            m_os( std::cout.rdbuf() )
        {
            if( !data.testsOrTags.empty() ) {
                std::string groupName;
                for( std::size_t i = 0; i < data.testsOrTags.size(); ++i ) {
                    if( i != 0 )
                        groupName += " ";
                    groupName += data.testsOrTags[i];
                }
                TestCaseFilters filters( groupName );
                for( std::size_t i = 0; i < data.testsOrTags.size(); ++i ) {
                    std::string filter = data.testsOrTags[i];
                    if( startsWith( filter, "[" ) || startsWith( filter, "~[" ) )
                        filters.addTags( filter );
                    else
                        filters.addFilter( TestCaseFilter( filter ) );
                }
                m_filterSets.push_back( filters );
            }
        }